

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

string * __thiscall
vkt::shaderexecutor::intervalToString<tcu::Vector<int,2>>
          (string *__return_storage_ptr__,shaderexecutor *this,FloatFormat *fmt,IVal *ival)

{
  long lVar1;
  ostringstream oss;
  undefined1 auStack_1d8 [8];
  undefined8 uStack_1d0;
  IVal local_1c8;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  uStack_1d0 = 0x9e5901;
  std::__cxx11::ostringstream::ostringstream(local_190);
  lVar1 = 0x10;
  do {
    auStack_1d8[lVar1] = 0;
    *(undefined8 *)((long)&uStack_1d0 + lVar1) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1c8.m_data[0].m_hasNaN + lVar1) = 0xfff0000000000000;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x40);
  local_1c8.m_data[0]._0_8_ = *(undefined8 *)fmt;
  local_1c8.m_data[0].m_lo = *(double *)&fmt->m_fractionBits;
  local_1c8.m_data[0].m_hi = *(double *)&fmt->m_hasInf;
  local_1c8.m_data[1].m_hasNaN = fmt->m_exactPrecision;
  local_1c8.m_data[1]._1_7_ = *(undefined7 *)&fmt->field_0x19;
  local_1c8.m_data[1].m_lo = fmt->m_maxValue;
  local_1c8.m_data[1].m_hi = *(double *)(fmt + 1);
  uStack_1d0 = 0x9e595b;
  ContainerTraits<tcu::Vector<int,_2>,_tcu::Vector<tcu::Interval,_2>_>::doPrintIVal
            ((FloatFormat *)this,&local_1c8,(ostream *)local_190);
  uStack_1d0 = 0x9e5968;
  std::__cxx11::stringbuf::str();
  uStack_1d0 = 0x9e5979;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  uStack_1d0 = 0x9e5986;
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string intervalToString (const FloatFormat& fmt, const typename Traits<T>::IVal& ival)
{
	ostringstream oss;
	printIVal<T>(fmt, ival, oss);
	return oss.str();
}